

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O2

RenderContext *
glu::createRenderContext(Platform *platform,CommandLine *cmdLine,RenderConfig *config)

{
  int iVar1;
  SurfaceType SVar2;
  undefined4 extraout_var;
  char *__s;
  ContextFactory *factory;
  FactoryBase *this_00;
  undefined4 extraout_var_00;
  char *pcVar3;
  FboRenderContext *this_01;
  undefined4 extraout_var_01;
  NotSupportedError *pNVar4;
  int factoryNdx;
  size_t index;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GenericFactoryRegistry *this;
  
  iVar1 = (*platform->_vptr_Platform[3])();
  this = (GenericFactoryRegistry *)CONCAT44(extraout_var,iVar1);
  __s = tcu::CommandLine::getGLContextType(cmdLine);
  if ((this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_factories).
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"OpenGL is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0x8d);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (__s == (char *)0x0) {
    factory = tcu::FactoryRegistry<glu::ContextFactory>::getDefaultFactory
                        ((FactoryRegistry<glu::ContextFactory> *)this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,(allocator<char> *)&local_70);
    factory = (ContextFactory *)tcu::GenericFactoryRegistry::getFactoryByName(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (factory == (ContextFactory *)0x0) {
      tcu::print("ERROR: Unknown or unsupported GL context type \'%s\'\n",__s);
      tcu::print("Supported GL context types:\n");
      for (index = 0;
          (long)index <
          (long)(int)((ulong)((long)(this->m_factories).
                                    super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_factories).
                                   super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
          index = index + 1) {
        this_00 = (FactoryBase *)tcu::GenericFactoryRegistry::getFactoryByIndex(this,index);
        iVar1 = (*(this_00->super_AbstractFactory)._vptr_AbstractFactory[2])(this_00);
        pcVar3 = tcu::FactoryBase::getDescription(this_00);
        tcu::print("  %s: %s\n",CONCAT44(extraout_var_00,iVar1),pcVar3);
      }
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unknown GL context type \'",&local_91);
      std::operator+(&local_70,&local_50,__s);
      std::operator+(&local_90,&local_70,"\'");
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,local_90._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0x9e);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  SVar2 = tcu::CommandLine::getSurfaceType(cmdLine);
  if (SVar2 == SURFACETYPE_FBO) {
    this_01 = (FboRenderContext *)operator_new(0x40);
    FboRenderContext::FboRenderContext(this_01,factory,config,cmdLine);
  }
  else {
    iVar1 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                      (factory,config,cmdLine);
    this_01 = (FboRenderContext *)CONCAT44(extraout_var_01,iVar1);
  }
  return &this_01->super_RenderContext;
}

Assistant:

RenderContext* createRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, const RenderConfig& config)
{
	const ContextFactoryRegistry&	registry		= platform.getGLPlatform().getContextFactoryRegistry();
	const char*						factoryName		= cmdLine.getGLContextType();
	const ContextFactory*			factory			= DE_NULL;

	if (registry.empty())
		throw tcu::NotSupportedError("OpenGL is not supported", DE_NULL, __FILE__, __LINE__);

	if (factoryName)
	{
		factory = registry.getFactoryByName(factoryName);

		if (!factory)
		{
			tcu::print("ERROR: Unknown or unsupported GL context type '%s'\n", factoryName);
			tcu::print("Supported GL context types:\n");

			for (int factoryNdx = 0; factoryNdx < (int)registry.getFactoryCount(); factoryNdx++)
			{
				const ContextFactory* curFactory = registry.getFactoryByIndex(factoryNdx);
				tcu::print("  %s: %s\n", curFactory->getName(), curFactory->getDescription());
			}

			throw tcu::NotSupportedError((std::string("Unknown GL context type '") + factoryName + "'").c_str(), DE_NULL, __FILE__, __LINE__);
		}
	}
	else
		factory = registry.getDefaultFactory();

	if (cmdLine.getSurfaceType() == tcu::SURFACETYPE_FBO)
		return new FboRenderContext(*factory, config, cmdLine);
	else
		return factory->createContext(config, cmdLine);
}